

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O1

QRect __thiscall QTabBarPrivate::normalizedScrollRect(QTabBarPrivate *this,int index)

{
  QWidget *this_00;
  QWidgetData *pQVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  LayoutDirection LVar5;
  QStyle *pQVar6;
  int iVar7;
  undefined4 uVar8;
  Representation RVar9;
  int iVar10;
  uint uVar11;
  long in_FS_OFFSET;
  bool bVar12;
  int iVar13;
  QRect QVar14;
  QRect local_128;
  undefined1 local_118 [12];
  Representation RStack_10c;
  undefined1 local_108 [12];
  Representation RStack_fc;
  undefined1 local_f8 [12];
  Representation RStack_ec;
  undefined1 local_e8 [12];
  Representation RStack_dc;
  QStyleOptionTab local_d8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  if ((((this->leftB->super_QAbstractButton).super_QWidget.data)->widget_attributes & 0x10000) == 0)
  {
    memset(&local_d8,0xaa,0xa0);
    QStyleOptionTab::QStyleOptionTab(&local_d8);
    (**(code **)(*(long *)this_00 + 0x1c8))(this_00,&local_d8,this->currentIndex);
    pQVar1 = this_00->data;
    local_d8.super_QStyleOption.rect.x2.m_i = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
    local_d8.super_QStyleOption.rect.y2.m_i = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
    local_d8.super_QStyleOption.rect.x1.m_i = 0;
    local_d8.super_QStyleOption.rect.y1.m_i = 0;
    local_e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffff20 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar6 = QWidget::style(this_00);
    _local_e8 = (QRect)(**(code **)(*(long *)pQVar6 + 0xc0))(pQVar6,0x35,&local_d8,this_00);
    local_f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffff10 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar6 = QWidget::style(this_00);
    _local_f8 = (QRect)(**(code **)(*(long *)pQVar6 + 0xc0))(pQVar6,0x36,&local_d8,this_00);
    local_108._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffff00 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar6 = QWidget::style(this_00);
    _local_108 = (QRect)(**(code **)(*(long *)pQVar6 + 0xc0))(pQVar6,0x18,&local_d8,this_00);
    local_118._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xfffffffffffffef0 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar6 = QWidget::style(this_00);
    _local_118 = (QRect)(**(code **)(*(long *)pQVar6 + 0xc0))(pQVar6,0x37,&local_d8,this_00);
    if ((this->shape - RoundedWest & 0xfffffffa) == 0) {
      iVar7 = (this_00->data->crect).y2.m_i - (this_00->data->crect).y1.m_i;
      iVar10 = (iVar7 - (iVar7 + 1 >> 0x1f)) + 1 >> 1;
      if ((int)local_f8._4_4_ < iVar10 && (int)local_e8._4_4_ < iVar10) {
        uVar11 = RStack_ec.m_i + 1;
        RVar9.m_i = iVar7 + 1;
      }
      else {
        uVar11 = 0;
        RVar9.m_i = local_e8._4_4_;
        if ((int)local_e8._4_4_ < iVar10 || (int)local_f8._4_4_ < iVar10) {
          uVar11 = RStack_dc.m_i + 1;
          RVar9.m_i = local_f8._4_4_;
        }
      }
      lVar2 = (this->tabList).d.size;
      if (lVar2 + -1 == (long)index) {
        bVar12 = false;
      }
      else {
        bVar12 = RVar9.m_i !=
                 (((this->tabList).d.ptr[lVar2 + -1]->rect).y2.m_i - this->scrollOffset) + 1;
      }
      if (uVar11 + this->scrollOffset != 0 && index != 0) {
        if (local_108._4_4_ + -1 != RStack_fc.m_i || local_108._0_4_ + -1 != local_108._8_4_) {
          uVar11 = RStack_fc.m_i + 1;
        }
      }
      if (bVar12) {
        if (local_118._4_4_ + -1 != RStack_10c.m_i || local_118._0_4_ + -1 != local_118._8_4_) {
          RVar9.m_i = local_118._4_4_;
        }
      }
    }
    else {
      LVar5 = QWidget::layoutDirection(this_00);
      if (LVar5 == RightToLeft) {
        pQVar1 = this_00->data;
        local_128.x2.m_i = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
        local_128.y2.m_i = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
        local_128.x1.m_i = 0;
        local_128.y1.m_i = 0;
        _local_e8 = QStyle::visualRect(RightToLeft,&local_128,(QRect *)local_e8);
        pQVar1 = this_00->data;
        local_128.x2.m_i = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
        local_128.y2.m_i = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
        local_128.x1.m_i = 0;
        local_128.y1.m_i = 0;
        _local_f8 = QStyle::visualRect(RightToLeft,&local_128,(QRect *)local_f8);
        pQVar1 = this_00->data;
        local_128.x2.m_i = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
        local_128.y2.m_i = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
        local_128.x1.m_i = 0;
        local_128.y1.m_i = 0;
        _local_108 = QStyle::visualRect(RightToLeft,&local_128,(QRect *)local_108);
        pQVar1 = this_00->data;
        local_128.x2.m_i = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
        local_128.y2.m_i = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
        local_128.x1.m_i = 0;
        local_128.y1.m_i = 0;
        _local_118 = QStyle::visualRect(RightToLeft,&local_128,(QRect *)local_118);
      }
      pQVar1 = this_00->data;
      iVar7 = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
      RVar9.m_i = iVar7 + 1;
      iVar7 = (iVar7 - (RVar9.m_i >> 0x1f)) + 1 >> 1;
      if ((int)local_f8._0_4_ < iVar7 && (int)local_e8._0_4_ < iVar7) {
        uVar11 = local_f8._8_4_ + 1;
      }
      else {
        uVar11 = 0;
        RVar9.m_i = local_e8._0_4_;
        if ((int)local_e8._0_4_ < iVar7 || (int)local_f8._0_4_ < iVar7) {
          uVar11 = local_e8._8_4_ + 1;
          RVar9.m_i = local_f8._0_4_;
        }
      }
      iVar7 = this->scrollOffset;
      iVar10 = uVar11 + iVar7;
      lVar2 = (this->tabList).d.size;
      if (lVar2 + -1 == (long)index) {
        uVar8 = 0;
      }
      else {
        uVar8 = CONCAT31((int3)((uint)iVar7 >> 8),
                         RVar9.m_i != (((this->tabList).d.ptr[lVar2 + -1]->rect).x2.m_i - iVar7) + 1
                        );
      }
      if (iVar10 != 0 && index != 0) {
        iVar7 = -(uint)(local_108._0_4_.m_i + -1 == local_108._8_4_.m_i);
        iVar13 = -(uint)(local_108._4_4_.m_i + -1 == local_108._12_4_.m_i);
        auVar3._4_4_ = iVar7;
        auVar3._0_4_ = iVar7;
        auVar3._8_4_ = iVar13;
        auVar3._12_4_ = iVar13;
        iVar7 = movmskpd(CONCAT31((int3)((uint)iVar10 >> 8),iVar10 != 0 && index != 0),auVar3);
        if (iVar7 != 3) {
          uVar11 = local_108._8_4_.m_i + 1;
        }
      }
      if ((char)uVar8 != '\0') {
        iVar7 = -(uint)(local_118._8_4_.m_i == local_118._0_4_.m_i + -1);
        iVar10 = -(uint)(local_118._12_4_.m_i == local_118._4_4_.m_i + -1);
        auVar4._4_4_ = iVar7;
        auVar4._0_4_ = iVar7;
        auVar4._8_4_ = iVar10;
        auVar4._12_4_ = iVar10;
        iVar7 = movmskpd(uVar8,auVar4);
        if (iVar7 != 3) {
          RVar9.m_i = local_118._0_4_.m_i;
        }
      }
      iVar7 = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
    }
    QIcon::~QIcon(&local_d8.icon);
    if (&(local_d8.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_d8.text.d.d)->super_QArrayData,2,0x10);
      }
    }
    iVar10 = RVar9.m_i + -1;
    QStyleOption::~QStyleOption(&local_d8.super_QStyleOption);
  }
  else {
    pQVar1 = this_00->data;
    iVar10 = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
    iVar13 = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
    iVar7 = iVar13;
    if ((this->shape - RoundedWest & 0xfffffffa) == 0) {
      iVar7 = iVar10;
      iVar10 = iVar13;
    }
    uVar11 = 0;
  }
  QVar14.y1.m_i = 0;
  QVar14.x1.m_i = uVar11;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar14.y2.m_i = iVar7;
    QVar14.x2.m_i = iVar10;
    return QVar14;
  }
  __stack_chk_fail();
}

Assistant:

QRect QTabBarPrivate::normalizedScrollRect(int index)
{
    // "Normalized scroll rect" means return the free space on the tab bar
    // that doesn't overlap with scroll buttons or tear indicators, and
    // always return the rect as horizontal Qt::LeftToRight, even if the
    // tab bar itself is in a different orientation.

    Q_Q(QTabBar);
    // If scrollbuttons are not visible, then there's no tear either, and
    // the entire widget is the scroll rect.
    if (leftB->isHidden())
        return verticalTabs(shape) ? q->rect().transposed() : q->rect();

    QStyleOptionTab opt;
    q->initStyleOption(&opt, currentIndex);
    opt.rect = q->rect();

    QRect scrollButtonLeftRect = q->style()->subElementRect(QStyle::SE_TabBarScrollLeftButton, &opt, q);
    QRect scrollButtonRightRect = q->style()->subElementRect(QStyle::SE_TabBarScrollRightButton, &opt, q);
    QRect tearLeftRect = q->style()->subElementRect(QStyle::SE_TabBarTearIndicatorLeft, &opt, q);
    QRect tearRightRect = q->style()->subElementRect(QStyle::SE_TabBarTearIndicatorRight, &opt, q);

    if (verticalTabs(shape)) {
        int topEdge, bottomEdge;
        bool leftButtonIsOnTop = scrollButtonLeftRect.y() < q->height() / 2;
        bool rightButtonIsOnTop = scrollButtonRightRect.y() < q->height() / 2;

        if (leftButtonIsOnTop && rightButtonIsOnTop) {
            topEdge = scrollButtonRightRect.bottom() + 1;
            bottomEdge = q->height();
        } else if (!leftButtonIsOnTop && !rightButtonIsOnTop) {
            topEdge = 0;
            bottomEdge = scrollButtonLeftRect.top();
        } else {
            topEdge = scrollButtonLeftRect.bottom() + 1;
            bottomEdge = scrollButtonRightRect.top();
        }

        bool tearTopVisible = index != 0 && topEdge != -scrollOffset;
        bool tearBottomVisible = index != tabList.size() - 1 && bottomEdge != tabList.constLast()->rect.bottom() + 1 - scrollOffset;
        if (tearTopVisible && !tearLeftRect.isNull())
            topEdge = tearLeftRect.bottom() + 1;
        if (tearBottomVisible && !tearRightRect.isNull())
            bottomEdge = tearRightRect.top();

        return QRect(topEdge, 0, bottomEdge - topEdge, q->height());
    } else {
        if (q->layoutDirection() == Qt::RightToLeft) {
            scrollButtonLeftRect = QStyle::visualRect(Qt::RightToLeft, q->rect(), scrollButtonLeftRect);
            scrollButtonRightRect = QStyle::visualRect(Qt::RightToLeft, q->rect(), scrollButtonRightRect);
            tearLeftRect = QStyle::visualRect(Qt::RightToLeft, q->rect(), tearLeftRect);
            tearRightRect = QStyle::visualRect(Qt::RightToLeft, q->rect(), tearRightRect);
        }

        int leftEdge, rightEdge;
        bool leftButtonIsOnLeftSide = scrollButtonLeftRect.x() < q->width() / 2;
        bool rightButtonIsOnLeftSide = scrollButtonRightRect.x() < q->width() / 2;

        if (leftButtonIsOnLeftSide && rightButtonIsOnLeftSide) {
            leftEdge = scrollButtonRightRect.right() + 1;
            rightEdge = q->width();
        } else if (!leftButtonIsOnLeftSide && !rightButtonIsOnLeftSide) {
            leftEdge = 0;
            rightEdge = scrollButtonLeftRect.left();
        } else {
            leftEdge = scrollButtonLeftRect.right() + 1;
            rightEdge = scrollButtonRightRect.left();
        }

        bool tearLeftVisible = index != 0 && leftEdge != -scrollOffset;
        bool tearRightVisible = index != tabList.size() - 1 && rightEdge != tabList.constLast()->rect.right() + 1 - scrollOffset;
        if (tearLeftVisible && !tearLeftRect.isNull())
            leftEdge = tearLeftRect.right() + 1;
        if (tearRightVisible && !tearRightRect.isNull())
            rightEdge = tearRightRect.left();

        return QRect(leftEdge, 0, rightEdge - leftEdge, q->height());
    }
}